

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Am_Web_Data::Am_Web_Data(Am_Web_Data *this,Am_Web_Data *in_prototype)

{
  Am_Web_Initialize_Proc *pAVar1;
  
  (this->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002ea980;
  (this->interface).owner = this;
  pAVar1 = in_prototype->initialize_proc;
  this->create_proc = in_prototype->create_proc;
  this->initialize_proc = pAVar1;
  this->validate_proc = in_prototype->validate_proc;
  this->prototype = in_prototype;
  this->child = (Am_Web_Data *)0x0;
  this->sibling = in_prototype->child;
  in_prototype->child = this;
  this->validating = false;
  this->initialized = false;
  this->valid = false;
  this->out_list = (Output_Port *)0x0;
  this->in_list = (Input_Port *)0x0;
  this->invalid_list = (Input_Port *)0x0;
  this->changed_first = (Input_Port *)0x0;
  this->changed_last = (Input_Port *)0x0;
  return;
}

Assistant:

Web_Constraint(Am_Web_Data *in_owner) { owner = in_owner; }